

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::prepareFileForWrite(QPDFWriter *this)

{
  bool bVar1;
  element_type *peVar2;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [8];
  QPDFObjectHandle adbe;
  string local_d0;
  QPDFObjectHandle local_b0;
  allocator<char> local_99;
  QPDFObjectHandle local_98 [2];
  QPDFObjectHandle local_78;
  byte local_65;
  bool extensions_indirect;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle oh;
  QPDFObjectHandle root;
  QPDFWriter *this_local;
  
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  QPDF::fixDanglingReferences(peVar2->pdf,false);
  std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this);
  QPDF::getRoot((QPDF *)&oh.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/Extensions",&local_51);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)local_30,
             (string *)
             &oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_30);
  if (bVar1) {
    local_65 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_30);
    if ((bool)local_65) {
      QTC::TC("qpdf","QPDFWriter make Extensions direct",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"/Extensions",&local_99)
      ;
      QPDFObjectHandle::shallowCopy(&local_b0);
      QPDFObjectHandle::replaceKeyAndGetNew
                (&local_78,
                 (string *)
                 &oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,local_98);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)local_30,&local_78);
      QPDFObjectHandle::~QPDFObjectHandle(&local_78);
      QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
      std::__cxx11::string::~string((string *)local_98);
      std::allocator<char>::~allocator(&local_99);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"/ADBE",
               (allocator<char> *)
               ((long)&adbe.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_30,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&adbe.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_108,"/ADBE",&local_109);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_e8,(string *)local_30);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_e8);
      if (bVar1) {
        QTC::TC("qpdf","QPDFWriter make ADBE direct",(byte)~local_65 & 1);
        QPDFObjectHandle::makeDirect((QPDFObjectHandle *)local_e8,false);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"/ADBE",&local_131);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_30,&local_130,(QPDFObjectHandle *)local_e8);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e8);
    }
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFWriter::prepareFileForWrite()
{
    m->pdf.fixDanglingReferences();
    auto root = m->pdf.getRoot();
    auto oh = root.getKey("/Extensions");
    if (oh.isDictionary()) {
        const bool extensions_indirect = oh.isIndirect();
        if (extensions_indirect) {
            QTC::TC("qpdf", "QPDFWriter make Extensions direct");
            oh = root.replaceKeyAndGetNew("/Extensions", oh.shallowCopy());
        }
        if (oh.hasKey("/ADBE")) {
            auto adbe = oh.getKey("/ADBE");
            if (adbe.isIndirect()) {
                QTC::TC("qpdf", "QPDFWriter make ADBE direct", extensions_indirect ? 0 : 1);
                adbe.makeDirect();
                oh.replaceKey("/ADBE", adbe);
            }
        }
    }
}